

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O1

void render(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  Vec3<float> *__cur;
  pointer pfVar5;
  Vec3f *pVVar6;
  int fi;
  value_type_conflict1 *__val;
  pointer pVVar7;
  int k;
  long lVar8;
  pointer *ppvVar9;
  long lVar10;
  float fVar11;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> framebufferRightEye;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> framebufferLeftEye;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> framebuffer;
  Vec3f pointRight;
  Vec3f pointLeft;
  vector<float,_std::allocator<float>_> zBufferRight;
  vector<float,_std::allocator<float>_> zBufferLeft;
  Vec2f text [3];
  Vec3f pointsLeft [3];
  Vec3f norms [3];
  Vec3f pointsRight [3];
  Matrix ViewPort;
  Matrix TotalTransformRight;
  Matrix TotalTransformLeft;
  Matrix ProjectionRight;
  Matrix ProjectionLeft;
  Matrix ModelViewRight;
  Matrix ModelViewLeft;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> local_368;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> local_348;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> local_328;
  Vec3f local_310;
  Vec3f local_304;
  vector<float,_std::allocator<float>_> local_2f8;
  vector<float,_std::allocator<float>_> local_2d8;
  undefined1 local_2b8 [4];
  float fStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  pointer local_2a8;
  undefined1 local_294 [4];
  float fStack_290;
  undefined1 local_28c [4];
  Matrix local_288;
  undefined4 local_268;
  string local_258;
  string local_238;
  string local_218;
  Matrix local_1f8;
  undefined4 local_1d8;
  float fStack_1d0;
  undefined1 auStack_1cc [4];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_1a8;
  Matrix local_1a0;
  Matrix local_180;
  Matrix local_160;
  Matrix local_140;
  Matrix local_120;
  Matrix local_100;
  Matrix local_e0;
  Vec3f local_c0;
  Vec3f local_b0;
  Vec3f local_a0;
  Vec3f local_94;
  Vec3f local_88;
  Vec3f local_7c;
  Matrix local_70;
  Matrix local_50;
  
  TGAImage::read_tga_file(&texture,"../res/diablo3_pose_diffuse.tga");
  TGAImage::flip_vertically(&texture);
  local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x2400000);
  pVVar7 = local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
           super__Vector_impl_data._M_start + 0x300000;
  local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pVVar7;
  memset(local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x2400000);
  local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar7;
  local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x2400000);
  pVVar7 = local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
           super__Vector_impl_data._M_start + 0x300000;
  local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pVVar7;
  memset(local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x2400000);
  local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar7;
  local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x2400000);
  pVVar7 = local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
           super__Vector_impl_data._M_start + 0x300000;
  local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pVVar7;
  memset(local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x2400000);
  local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar7;
  pfVar5 = (pointer)operator_new(0xc00000);
  lVar10 = 0;
  local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = pfVar5;
  local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = pfVar5;
  local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pfVar5 + 0x300000;
  memset(pfVar5,0,0xc00000);
  do {
    *(undefined4 *)((long)pfVar5 + lVar10) = 0xff7fffff;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc00000);
  local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = pfVar5 + 0x300000;
  pfVar5 = (pointer)operator_new(0xc00000);
  lVar10 = 0;
  local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = pfVar5;
  local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = pfVar5;
  local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pfVar5 + 0x300000;
  memset(pfVar5,0,0xc00000);
  do {
    *(undefined4 *)((long)pfVar5 + lVar10) = 0xff7fffff;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc00000);
  local_7c.x = -0.1;
  local_7c.y = 0.0;
  local_7c.z = 2.5;
  local_b0.z = 0.0;
  local_b0.x = 0.0;
  local_b0.y = 0.0;
  local_88.x = 0.0;
  local_88.y = 1.0;
  local_88.z = 0.0;
  local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = pfVar5 + 0x300000;
  lookat(&local_e0,&local_7c,&local_b0,&local_88);
  local_94.x = 0.1;
  local_94.y = 0.0;
  local_94.z = 2.5;
  local_c0.z = 0.0;
  local_c0.x = 0.0;
  local_c0.y = 0.0;
  local_a0.x = 0.0;
  local_a0.y = 1.0;
  local_a0.z = 0.0;
  lookat(&local_100,&local_94,&local_c0,&local_a0);
  viewport(&local_1a0,0x100,0xc0,0x600,0x480);
  projection(&local_120,2.5019991);
  projection(&local_140,2.5019991);
  Matrix::operator*(&local_288,&local_1a0,&local_120);
  Matrix::operator*(&local_160,&local_288,&local_e0);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_288.m);
  Matrix::operator*(&local_288,&local_1a0,&local_140);
  Matrix::operator*(&local_180,&local_288,&local_100);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_288.m);
  fi = 0;
  local_268 = 0;
  local_288.m.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288._24_8_ = 0;
  local_288.m.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.m.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8._0_4_ = 0.0;
  local_1c8._4_4_ = 0.0;
  local_1c8._8_8_ = 0;
  local_304.x = 0.0;
  local_304.y = 0.0;
  local_304.z = 0.0;
  local_310.x = 0.0;
  local_310.y = 0.0;
  local_310.z = 0.0;
  if (0 < (int)((ulong)((long)diablo.faces.
                              super__Vector_base<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>,_std::allocator<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)diablo.faces.
                             super__Vector_base<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>,_std::allocator<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    do {
      lVar8 = 8;
      lVar10 = 0;
      do {
        iVar4 = Model::vert(&diablo,fi,(int)lVar10);
        pVVar6 = Model::point(&diablo,iVar4);
        local_304.x = pVVar6->x;
        local_304.y = pVVar6->y;
        local_304.z = pVVar6->z;
        iVar4 = Model::vert(&diablo,fi,(int)lVar10);
        pVVar6 = Model::point(&diablo,iVar4);
        local_310.x = pVVar6->x;
        local_310.y = pVVar6->y;
        local_310.z = pVVar6->z;
        v2m(&local_1f8,&local_304);
        Matrix::operator*(&local_50,&local_160,&local_1f8);
        m2v((Matrix *)local_2b8);
        *(undefined1 (*) [4])((long)&fStack_290 + lVar8) = local_2b8;
        *(ulong *)(local_28c + lVar8) = CONCAT44(uStack_2b0,fStack_2b4);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&local_50.m);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&local_1f8.m);
        v2m(&local_1f8,&local_310);
        Matrix::operator*(&local_70,&local_180,&local_1f8);
        m2v((Matrix *)local_2b8);
        *(undefined1 (*) [4])((long)&fStack_1d0 + lVar8) = local_2b8;
        *(ulong *)(auStack_1cc + lVar8) = CONCAT44(uStack_2b0,fStack_2b4);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&local_70.m);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&local_1f8.m);
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 0xc;
      } while (lVar10 != 3);
      local_1f8.m.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1f8.rows = 0;
      local_1f8.cols = 0;
      local_1f8.m.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.m.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8 = 0;
      local_2b8 = (undefined1  [4])0x0;
      fStack_2b4 = 0.0;
      uStack_2b0 = 0;
      uStack_2ac = 0;
      local_2a8 = (pointer)0x0;
      ppvVar9 = &local_1f8.m.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar10 = 0;
      do {
        Model::normal((Model *)local_294,0x10b248,fi);
        *(undefined1 (*) [4])&((_Vector_impl_data *)(ppvVar9 + -1))->_M_start = local_294;
        *(float *)((long)ppvVar9 + -4) = fStack_290;
        *(undefined1 (*) [4])ppvVar9 = local_28c;
        Model::uv((Model *)local_294,0x10b248,fi);
        *(ulong *)(local_2b8 + lVar10 * 8) = CONCAT44(fStack_290,local_294);
        lVar10 = lVar10 + 1;
        ppvVar9 = (pointer *)((long)ppvVar9 + 0xc);
      } while (lVar10 != 3);
      rasterizeTriangle((Vec3f *)&local_288,(Vec3f *)&local_1f8,(Vec2f *)local_2b8,&local_348,
                        &local_2d8);
      rasterizeTriangle((Vec3f *)local_1c8,(Vec3f *)&local_1f8,(Vec2f *)local_2b8,&local_368,
                        &local_2f8);
      fi = fi + 1;
      iVar4 = (int)((ulong)((long)diablo.faces.
                                  super__Vector_base<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>,_std::allocator<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)diablo.faces.
                                 super__Vector_base<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>,_std::allocator<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(fi,iVar4 * -0x55555555) != fi + iVar4 * 0x55555555 < 0);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Left","");
  writeInFile(&local_348,0x800,0x600,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Right","");
  writeInFile(&local_368,0x800,0x600,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  lVar10 = 8;
  do {
    fVar11 = *(float *)((long)&(local_348.
                                super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                                _M_impl.super__Vector_impl_data._M_start)->x + lVar10);
    fVar1 = *(float *)((long)local_348.
                             super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar10 + -4);
    if (fVar11 <= fVar1) {
      fVar11 = fVar1;
    }
    fVar1 = *(float *)((long)local_348.
                             super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar10 + -8);
    if (fVar11 <= fVar1) {
      fVar11 = fVar1;
    }
    if (1.0 < fVar11) {
      fVar11 = 1.0 / fVar11;
      fVar1 = *(float *)((long)&(local_348.
                                 super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->x + lVar10);
      *(float *)((long)local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar10 + -8) =
           fVar11 * *(float *)((long)local_348.
                                     super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar10 + -8);
      *(float *)((long)local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar10 + -4) =
           *(float *)((long)local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar10 + -4) * fVar11;
      *(float *)((long)&(local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start)->x + lVar10) = fVar1 * fVar11;
    }
    fVar11 = *(float *)((long)&(local_368.
                                super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                                _M_impl.super__Vector_impl_data._M_start)->x + lVar10);
    fVar1 = *(float *)((long)local_368.
                             super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar10 + -4);
    if (fVar11 <= fVar1) {
      fVar11 = fVar1;
    }
    fVar1 = *(float *)((long)local_368.
                             super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar10 + -8);
    if (fVar11 <= fVar1) {
      fVar11 = fVar1;
    }
    if (1.0 < fVar11) {
      fVar11 = 1.0 / fVar11;
      fVar1 = *(float *)((long)&(local_368.
                                 super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->x + lVar10);
      *(float *)((long)local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar10 + -8) =
           fVar11 * *(float *)((long)local_368.
                                     super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar10 + -8);
      *(float *)((long)local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar10 + -4) =
           *(float *)((long)local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar10 + -4) * fVar11;
      *(float *)((long)&(local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start)->x + lVar10) = fVar1 * fVar11;
    }
    fVar11 = *(float *)((long)local_368.
                              super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl
                              .super__Vector_impl_data._M_start + lVar10 + -8);
    fVar1 = *(float *)((long)&(local_368.
                               super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                               _M_impl.super__Vector_impl_data._M_start)->x + lVar10);
    fVar2 = *(float *)((long)local_348.
                             super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar10 + -4);
    fVar3 = *(float *)((long)local_368.
                             super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar10 + -4);
    *(float *)((long)local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar10 + -8) =
         (*(float *)((long)local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar10 + -8) +
         *(float *)((long)&(local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->x + lVar10)) * 0.5;
    *(float *)((long)local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar10 + -4) = (fVar2 + fVar3) * 0.5
    ;
    *(float *)((long)&(local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x + lVar10) =
         (fVar11 + fVar1) * 0.5;
    lVar10 = lVar10 + 0xc;
  } while (lVar10 != 0x2400008);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"17","");
  writeInFile(&local_328,0x800,0x600,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_180.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_160.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_140.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_120.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_1a0.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_100.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_e0.m);
  if (local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void render(){
    //std::vector<float> zBuffer(width*height);
    //Vec3f camera = Vec3f(0, 0, 2); // camera.z used in the projection matrix, != 0

    texture.read_tga_file("../res/diablo3_pose_diffuse.tga"); // getting texture
    texture.flip_vertically();
    //std::fill(zBuffer.begin(), zBuffer.end(), std::numeric_limits<float>::lowest()); // filling z-buffer

    std::vector<Vec3f> framebuffer(width*height); //used for the fusion
    std::vector<Vec3f> framebufferLeftEye(width*height); //image used for left eye
    std::vector<Vec3f> framebufferRightEye(width*height);//image used for right eye

    //Matrix VP = viewport((float)width/8, (float)height/8, (float)width*3/4, (float)height*3/4); // getting viewport
    //Matrix P  = projection(camera.z);// getting perspective matrix


    std::vector<float> zBufferLeft(width*height);
    std::fill(zBufferLeft.begin(), zBufferLeft.end(), std::numeric_limits<float>::lowest());
    std::vector<float> zBufferRight(width*height);
    std::fill(zBufferRight.begin(), zBufferRight.end(), std::numeric_limits<float>::lowest());

    Vec3f center(0,0,0);

    Vec3f leftEye(-0.1, 0, 2.5);
    Vec3f rightEye(0.1, 0, 2.5);
    Matrix ModelViewLeft = lookat(leftEye, center, Vec3f(0,1,0));
    Matrix ModelViewRight = lookat(rightEye, center, Vec3f(0,1,0));
    Matrix ViewPort = viewport(width/8, height/8, width*3/4, height*3/4);

    Matrix ProjectionLeft = projection((leftEye - center).norm());
    Matrix ProjectionRight = projection((rightEye - center).norm());

    Matrix TotalTransformLeft = ViewPort * ProjectionLeft * ModelViewLeft;
    Matrix TotalTransformRight = ViewPort * ProjectionRight * ModelViewRight;


    // drawing things here
    Vec3f pointsLeft[nbPoints];
    Vec3f pointsRight[nbPoints];
    Vec3f pointLeft;
    Vec3f pointRight;

    #pragma omp parallel for
    for(int i = 0; i < diablo.nfaces(); i++){   // fetching diablo's mesh
        for(int j = 0; j < nbPoints; j++){
            pointLeft = diablo.point(diablo.vert(i, j));
            pointRight = diablo.point(diablo.vert(i, j));

            pointsLeft[j] = m2v(TotalTransformLeft * v2m(pointLeft));
            pointsRight[j] = m2v(TotalTransformRight * v2m(pointRight));
        }

        Vec3f norms[nbPoints];
        Vec2f text[nbPoints];
        // retrieving normal for each vertices, and textures position
        for(int k = 0 ; k < nbPoints; k++){
            norms[k] = diablo.normal(i, k);
            text[k] = diablo.uv(i, k);
        }
        rasterizeTriangle(pointsLeft, norms, text, framebufferLeftEye, zBufferLeft);
        rasterizeTriangle(pointsRight, norms, text, framebufferRightEye, zBufferRight);
    }

    // generating file
    writeInFile(framebufferLeftEye, width, height, "Left");
    writeInFile(framebufferRightEye, width, height, "Right");

    for (size_t i = 0; i < height * width; ++i) {
        Vec3f &c = framebufferLeftEye[i];
        Vec3f &cbis = framebufferRightEye[i];
        Vec3f res;
        float max = std::max(c[0], std::max(c[1], c[2]));
        if (max > 1) c = c * (1. / max);
        float maxbis = std::max(cbis[0], std::max(cbis[1], cbis[2]));
        if (maxbis > 1) cbis = cbis * (1. / maxbis);

        res = Vec3f((c.x + c.z) / 2., (c.y + cbis.y)/2., (cbis.x + cbis.z) / 2.);

        framebuffer[i] = res ;

    }


    writeInFile(framebuffer, width, height, "17");



}